

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result * __thiscall
unodb::detail::
basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::last(iter_result *__return_storage_ptr__,
      basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
      *this)

{
  uintptr_t uVar1;
  int64_t i;
  ulong uVar2;
  
  uVar2 = 0xff;
  while( true ) {
    if ((long)uVar2 < 0) {
      cannot_happen("/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0xab8,"last");
    }
    if ((this->children)._M_elems[uVar2 & 0xff].value._M_i.tagged_ptr != 0) break;
    uVar2 = uVar2 - 1;
  }
  uVar1 = basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr((olc_node_header *)this,I256);
  (__return_storage_ptr__->node).tagged_ptr = uVar1;
  __return_storage_ptr__->key_byte = (byte)uVar2;
  __return_storage_ptr__->child_index = (byte)uVar2;
  __return_storage_ptr__->prefix =
       (key_prefix_snapshot)
       (this->
       super_basic_inode_256_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       ).
       super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
       .k_prefix;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_256::iter_result
  last() noexcept {
    for (std::int64_t i = basic_inode_256::capacity - 1; i >= 0; i--) {
      if (children[static_cast<std::uint8_t>(i)] != nullptr) {
        const auto key = static_cast<std::byte>(i);  // child_index is key byte
        const auto child_index = static_cast<std::uint8_t>(i);
        return {node_ptr{this, node_type::I256}, key, child_index,
                this->get_key_prefix().get_snapshot()};
      }
    }
    // because we always have at least 49 keys.
    UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
  }